

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O2

int right_of_aliens_proc(Am_Object *param_1)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object this_alien;
  Am_Object local_38;
  Am_Value_List aliens;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0x92f0,0x82);
  Am_Value_List::Am_Value_List(&aliens,pAVar5);
  this_alien.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&local_38,0x1092f0);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::End();
  do {
    cVar1 = Am_Value_List::First();
    if (cVar1 != '\0') {
LAB_00104964:
      Am_Object::~Am_Object(&this_alien);
      Am_Value_List::~Am_Value_List(&aliens);
      return iVar2;
    }
    pAVar5 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&this_alien,pAVar5);
    Am_Object::Get((ushort)&this_alien,0xb0);
    cVar1 = Am_Value::Valid();
    if (cVar1 != '\0') {
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&this_alien,100);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&this_alien,0x66);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      iVar2 = (iVar2 - (iVar3 + iVar4)) + -10;
      goto LAB_00104964;
    }
    Am_Value_List::Prev();
  } while( true );
}

Assistant:

Am_Define_No_Self_Formula(int, right_of_aliens)
{
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object this_alien;
  int right = Aliens.Get_Owner().Get(Am_WIDTH);
  for (aliens.End(); !aliens.First(); aliens.Prev()) {
    this_alien = aliens.Get();
    if (this_alien.Get(Am_IMAGE).Valid()) {
      return right - (int)this_alien.Get(Am_LEFT) -
             (int)this_alien.Get(Am_WIDTH) - 10;
    }
  }
  return right;
}